

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audit.cpp
# Opt level: O2

ssize_t __thiscall
Vault::Sys::Audit::read_abi_cxx11_(Audit *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Path local_50;
  Url local_30;
  
  client = *(Client **)CONCAT44(in_register_00000034,__fd);
  local_50.value_._M_dataplus._M_p = (pointer)&local_50.value_.field_2;
  local_50.value_.field_2._M_allocated_capacity = 0;
  local_50.value_.field_2._8_8_ = 0;
  local_50.value_._M_string_length = 0;
  getUrl(&local_30,(Audit *)CONCAT44(in_register_00000034,__fd),&local_50);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Audit::read() {
  return HttpConsumer::get(client_, getUrl(Path{}));
}